

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

tuple<bool,_bool,_unsigned_int> * __thiscall
spvtools::val::ValidationState_t::EvalInt32IfConst
          (tuple<bool,_bool,_unsigned_int> *__return_storage_ptr__,ValidationState_t *this,
          uint32_t id)

{
  pointer puVar1;
  bool bVar2;
  uint32_t uVar3;
  int32_t iVar4;
  Instruction *pIVar5;
  uint uVar6;
  bool bVar7;
  undefined1 uVar8;
  
  pIVar5 = FindDef(this,id);
  if (pIVar5 == (Instruction *)0x0) {
    __assert_fail("inst",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x59b,
                  "std::tuple<bool, bool, uint32_t> spvtools::val::ValidationState_t::EvalInt32IfConst(uint32_t) const"
                 );
  }
  uVar3 = (pIVar5->inst_).type_id;
  if (uVar3 == 0) {
    uVar6 = 0;
    bVar7 = false;
    uVar8 = 0;
  }
  else {
    bVar2 = IsIntScalarType(this,uVar3);
    uVar6 = 0;
    bVar7 = false;
    uVar8 = 0;
    if (bVar2) {
      uVar3 = GetBitWidth(this,uVar3);
      uVar6 = 0;
      bVar7 = false;
      uVar8 = 0;
      if (uVar3 == 0x20) {
        iVar4 = spvOpcodeIsConstant((uint)(pIVar5->inst_).opcode);
        uVar8 = 1;
        if (iVar4 != 0) {
          iVar4 = spvOpcodeIsSpecConstant((uint)(pIVar5->inst_).opcode);
          uVar6 = 0;
          if (iVar4 == 0) {
            bVar7 = true;
            if ((pIVar5->inst_).opcode != 0x2e) {
              puVar1 = (pIVar5->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((long)(pIVar5->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1 != 0x10) {
                __assert_fail("inst->words().size() == 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validation_state.cpp"
                              ,0x5ad,
                              "std::tuple<bool, bool, uint32_t> spvtools::val::ValidationState_t::EvalInt32IfConst(uint32_t) const"
                             );
              }
              uVar6 = puVar1[3];
            }
            uVar8 = 1;
            goto LAB_001928d8;
          }
        }
        uVar6 = 0;
        bVar7 = false;
      }
    }
  }
LAB_001928d8:
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>).
  super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
  super__Head_base<2UL,_unsigned_int,_false>._M_head_impl = uVar6;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>).
  super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>._M_head_impl = bVar7
  ;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>).
  super__Tuple_impl<1UL,_bool,_unsigned_int>.field_0x5 = uVar8;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<bool, bool, uint32_t> ValidationState_t::EvalInt32IfConst(
    uint32_t id) const {
  const Instruction* const inst = FindDef(id);
  assert(inst);
  const uint32_t type = inst->type_id();

  if (type == 0 || !IsIntScalarType(type) || GetBitWidth(type) != 32) {
    return std::make_tuple(false, false, 0);
  }

  // Spec constant values cannot be evaluated so don't consider constant for
  // the purpose of this method.
  if (!spvOpcodeIsConstant(inst->opcode()) ||
      spvOpcodeIsSpecConstant(inst->opcode())) {
    return std::make_tuple(true, false, 0);
  }

  if (inst->opcode() == spv::Op::OpConstantNull) {
    return std::make_tuple(true, true, 0);
  }

  assert(inst->words().size() == 4);
  return std::make_tuple(true, true, inst->word(3));
}